

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float afVar2 [2];
  Vector<float,_3> *pVVar3;
  float *pfVar4;
  Vector<float,_2> *pVVar5;
  int r;
  long lVar6;
  long lVar7;
  Vector<float,_3> *pVVar8;
  long lVar9;
  int col_1;
  bool bVar10;
  undefined4 uVar11;
  Type in1;
  Type in0;
  Matrix<float,_2,_3> res;
  float afStack_2c [5];
  Matrix<float,_3,_2> retVal;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    afVar2 = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    afVar2[0] = 1.2;
    afVar2[1] = 0.5;
  }
  in0.m_data[0] = afVar2[0];
  in0.m_data[1] = afVar2[1];
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    in1.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in1.m_data[0] = -0.2;
    in1.m_data[1] = 0.5;
    in1.m_data[2] = 0.8;
  }
  pfVar4 = (float *)&retVal;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar6 != lVar9) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar9) = uVar11;
      lVar9 = lVar9 + 0xc;
    } while (lVar9 == 0xc);
    lVar7 = lVar7 + 1;
    pfVar4 = pfVar4 + 1;
    lVar6 = lVar6 + 0xc;
  } while (lVar7 != 3);
  pVVar3 = (Vector<float,_3> *)&retVal;
  lVar6 = 0;
  do {
    fVar1 = in1.m_data[lVar6];
    lVar7 = 0;
    pVVar8 = pVVar3;
    do {
      ((Vector<tcu::Vector<float,_3>,_2> *)pVVar8->m_data)->m_data[0].m_data[0] =
           in0.m_data[lVar7] * fVar1;
      lVar7 = lVar7 + 1;
      pVVar8 = pVVar8 + 1;
    } while (lVar7 == 1);
    lVar6 = lVar6 + 1;
    pVVar3 = (Vector<float,_3> *)(pVVar3->m_data + 1);
  } while (lVar6 != 3);
  pfVar4 = (float *)&res;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[2].m_data[1] = 0.0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar6 != lVar7) {
        uVar11 = 0;
      }
      pfVar4[lVar7 * 2] = (float)uVar11;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    pfVar4 = pfVar4 + 1;
    bVar10 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar10);
  pVVar5 = (Vector<float,_2> *)&res;
  pVVar3 = (Vector<float,_3> *)&retVal;
  lVar6 = 0;
  do {
    lVar7 = 0;
    pVVar8 = pVVar3;
    do {
      ((Vector<tcu::Vector<float,_2>,_3> *)pVVar5->m_data)->m_data[0].m_data[lVar7] =
           ((Vector<tcu::Vector<float,_3>,_2> *)pVVar8->m_data)->m_data[0].m_data[0];
      lVar7 = lVar7 + 1;
      pVVar8 = pVVar8 + 1;
    } while (lVar7 == 1);
    lVar6 = lVar6 + 1;
    pVVar5 = pVVar5 + 1;
    pVVar3 = (Vector<float,_3> *)(pVVar3->m_data + 1);
  } while (lVar6 != 3);
  afStack_2c[2] = res.m_data.m_data[0].m_data[0] + res.m_data.m_data[0].m_data[1];
  afStack_2c[3] = res.m_data.m_data[1].m_data[0] + res.m_data.m_data[1].m_data[1];
  afStack_2c[4] = res.m_data.m_data[2].m_data[0] + res.m_data.m_data[2].m_data[1];
  retVal.m_data.m_data[0].m_data._0_8_ = &evalCtx->color;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 1.4013e-45;
  retVal.m_data.m_data[1].m_data[1] = 2.8026e-45;
  lVar6 = 2;
  do {
    (evalCtx->color).m_data[(int)retVal.m_data.m_data[0].m_data[lVar6]] = afStack_2c[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}